

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void performace_test(void)

{
  FastQueue *this;
  uint local_240;
  uint local_23c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  pthread_t consumer [32];
  pthread_t producer [32];
  uint32_t pages_per_bucket;
  uint32_t bucket_num;
  
  this = (FastQueue *)operator_new(0xc0);
  FastQueue::FastQueue(this,0x10,0x10);
  fastqueue = this;
  start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (i_2 = 0; (uint)i_2 < producer_num; i_2 = i_2 + 1) {
    pthread_create(consumer + (long)i_2 + 0x1f,(pthread_attr_t *)0x0,producer_fun,p + i_2);
  }
  for (i_3 = 0; (uint)i_3 < consumer_num; i_3 = i_3 + 1) {
    pthread_create(consumer + (long)i_3 + -1,(pthread_attr_t *)0x0,consumer_fun,c + i_3);
  }
  for (local_23c = 0; local_23c < producer_num; local_23c = local_23c + 1) {
    pthread_join(consumer[(long)(int)local_23c + 0x1f],(void **)0x0);
  }
  for (local_240 = 0; local_240 < consumer_num; local_240 = local_240 + 1) {
    pthread_join(consumer[(long)(int)local_240 + -1],(void **)0x0);
  }
  return;
}

Assistant:

void performace_test(){
     uint32_t  bucket_num = 16, pages_per_bucket = 10;
    pthread_t producer[32], consumer[32];
    
    
    fastqueue = new FastQueue(bucket_num, bucket_num);
    
    start = std::chrono::steady_clock::now();


    for(int i = 0; i < producer_num; ++i){
        pthread_create(&producer[i], NULL, producer_fun, &p[i]);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_create(&consumer[i], NULL, consumer_fun, &c[i]);
    }

    for(int i = 0; i < producer_num; ++i){
        pthread_join(producer[i], NULL);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_join(consumer[i], NULL);
    }


}